

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_facade.cpp
# Opt level: O0

LCC_EVENT_TYPE license::hw_identifier::HwIdentifierFacade::validate_pc_signature(string *str_code)

{
  LCC_EVENT_TYPE LVar1;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_00;
  pointer pIVar2;
  logic_error *e;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  strategy;
  LCC_EVENT_TYPE result;
  undefined1 local_20 [4];
  LCC_API_HW_IDENTIFICATION_STRATEGY id_strategy;
  HwIdentifier pc_id;
  string *str_code_local;
  
  pc_id.m_data._M_elems = (_Type)str_code;
  HwIdentifier::HwIdentifier((HwIdentifier *)local_20,str_code);
  strategy_00 = HwIdentifier::get_identification_strategy((HwIdentifier *)local_20);
  strategy._M_t.
  super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>._M_head_impl._0_4_
       = 9;
  IdentificationStrategy::get_strategy((IdentificationStrategy *)&e,strategy_00);
  pIVar2 = std::
           unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
           ::operator->((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                         *)&e);
  strategy._M_t.
  super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>._M_head_impl._0_4_
       = (*pIVar2->_vptr_IdentificationStrategy[5])(pIVar2,local_20);
  std::
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  ::~unique_ptr((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                 *)&e);
  LVar1 = (LCC_EVENT_TYPE)
          strategy._M_t.
          super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
          ._M_t.
          super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
          .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>.
          _M_head_impl;
  HwIdentifier::~HwIdentifier((HwIdentifier *)local_20);
  return LVar1;
}

Assistant:

LCC_EVENT_TYPE HwIdentifierFacade::validate_pc_signature(const std::string& str_code) {
	HwIdentifier pc_id(str_code);
	LCC_API_HW_IDENTIFICATION_STRATEGY id_strategy = pc_id.get_identification_strategy();
	LCC_EVENT_TYPE result = IDENTIFIERS_MISMATCH;
	try {
		unique_ptr<IdentificationStrategy> strategy = IdentificationStrategy::get_strategy(id_strategy);
		result = strategy->validate_identifier(pc_id);
	} catch (logic_error& e) {
		LOG_ERROR("Error validating identifier %s: %s", str_code.c_str(), e.what());
		((void)(e));
	}
	return result;
}